

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O1

String * __thiscall
Diligent::GetCPUAccessFlagsString_abi_cxx11_
          (String *__return_storage_ptr__,Diligent *this,Uint32 CpuAccessFlags)

{
  uint *in_RCX;
  ulong uVar1;
  uint uVar2;
  bool bVar3;
  string msg;
  string local_60;
  uint local_3c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  if ((int)this == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"0","");
  }
  else {
    uVar1 = (ulong)this & 0xffffffff;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    uVar2 = 1;
    do {
      if ((uVar2 & (uint)uVar1) != 0) {
        if (__return_storage_ptr__->_M_string_length != 0) {
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
        }
        local_3c = uVar2;
        if (2 < uVar2) {
          FormatString<char[28],unsigned_int>
                    (&local_60,(Diligent *)"Unexpected CPU access flag ",(char (*) [28])&local_3c,
                     in_RCX);
          in_RCX = (uint *)0x4c0;
          DebugAssertionFailed
                    (local_60._M_dataplus._M_p,"GetSingleCPUAccessFlagString",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                     ,0x4c0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) {
            operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
          }
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        uVar1 = (ulong)((uint)uVar1 & ~uVar2);
      }
    } while (((int)uVar1 != 0) && (bVar3 = uVar2 < 2, uVar2 = uVar2 * 2, bVar3));
    if ((int)uVar1 != 0) {
      FormatString<char[30]>(&local_60,(char (*) [30])"Unknown CPU access flags left");
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"GetCPUAccessFlagsString",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                 ,0x4d3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String GetCPUAccessFlagsString(Uint32 CpuAccessFlags)
{
    if (CpuAccessFlags == 0)
        return "0";
    String Str;
    for (Uint32 Flag = CPU_ACCESS_READ; CpuAccessFlags && Flag <= CPU_ACCESS_WRITE; Flag <<= 1)
    {
        if (CpuAccessFlags & Flag)
        {
            if (Str.length())
                Str += '|';
            Str += GetSingleCPUAccessFlagString(Flag);
            CpuAccessFlags &= ~Flag;
        }
    }
    VERIFY(CpuAccessFlags == 0, "Unknown CPU access flags left");
    return Str;
}